

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::initialiseCost(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase,bool perturb)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined8 uVar4;
  reference pvVar5;
  double *pdVar6;
  byte in_CL;
  int in_ESI;
  long in_RDI;
  double dVar7;
  HighsLogOptions *log_options_;
  double perturbation2;
  HighsInt i_3;
  double row_cost_perturbation_base_;
  double xpert;
  double upper;
  double lower;
  HighsInt i_2;
  HighsInt i_1;
  HighsInt num_tot;
  double boxedRate;
  double average_abs_cost;
  HighsInt pct0;
  double abs_cost;
  HighsInt i;
  double sum_abs_cost;
  double max_abs_cost;
  double min_abs_cost;
  HighsInt num_original_nonzero_cost;
  bool report_cost_perturbation;
  HEkk *in_stack_ffffffffffffff20;
  double local_d0;
  HEkk *in_stack_ffffffffffffff40;
  int local_94;
  int local_6c;
  double local_68;
  int local_60;
  int local_5c;
  HighsLogOptions *local_58;
  double local_50;
  uint local_44;
  double local_40;
  int local_34;
  double local_30;
  HighsLogOptions *local_28;
  HighsLogOptions *local_20;
  uint local_18;
  byte local_12;
  byte local_11;
  int local_c;
  
  local_11 = in_CL & 1;
  local_c = in_ESI;
  initialiseLpColCost(in_stack_ffffffffffffff40);
  initialiseLpRowCost(in_stack_ffffffffffffff20);
  *(undefined1 *)(in_RDI + 0x28d4) = 0;
  *(undefined1 *)(in_RDI + 0x28d5) = 0;
  *(undefined4 *)(in_RDI + 0x8c8) = 0;
  if (((local_c != 1) && ((local_11 & 1) != 0)) &&
     ((*(double *)(in_RDI + 0x2818) != 0.0 || (NAN(*(double *)(in_RDI + 0x2818)))))) {
    local_12 = *(byte *)(*(long *)(in_RDI + 8) + 0x1d8) & 1;
    local_18 = 0;
    if (local_12 != 0) {
      lVar3 = *(long *)(in_RDI + 8);
      uVar4 = std::__cxx11::string::c_str();
      highsLogDev((HighsLogOptions *)(lVar3 + 0x380),kInfo,"Cost perturbation for %s\n",uVar4);
    }
    local_20 = (HighsLogOptions *)0x7ff0000000000000;
    local_28 = (HighsLogOptions *)0x0;
    local_30 = 0.0;
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x2198); local_34 = local_34 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                          (long)local_34);
      local_40 = ABS(*pvVar5);
      if ((local_12 & 1) != 0) {
        if ((local_40 != 0.0) || (NAN(local_40))) {
          local_18 = local_18 + 1;
          pdVar6 = std::min<double>((double *)&local_20,&local_40);
          local_20 = (HighsLogOptions *)*pdVar6;
        }
        local_30 = local_40 + local_30;
      }
      pdVar6 = std::max<double>((double *)&local_28,&local_40);
      local_28 = (HighsLogOptions *)*pdVar6;
    }
    local_44 = (int)(local_18 * 100) / *(int *)(in_RDI + 0x2198);
    local_50 = 0.0;
    if ((local_12 & 1) != 0) {
      highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kInfo,
                  "   Initially have %d nonzero costs (%3d%%)",(ulong)local_18,(ulong)local_44);
      if (local_18 == 0) {
        local_20 = (HighsLogOptions *)0x3ff0000000000000;
        local_28 = (HighsLogOptions *)0x3ff0000000000000;
        local_50 = 1.0;
        highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kInfo,
                    " but perturb as if max cost was 1\n");
      }
      else {
        local_50 = local_30 / (double)(int)local_18;
        highsLogDev(local_20,(HighsLogType)local_50,(int)local_28,*(long *)(in_RDI + 8) + 0x380,1,
                    " with min / average / max = %g / %g / %g\n");
      }
    }
    if (100.0 < (double)local_28) {
      dVar7 = sqrt((double)local_28);
      local_28 = (HighsLogOptions *)sqrt(dVar7);
      if ((local_12 & 1) != 0) {
        highsLogDev(local_28,(HighsLogType)(*(long *)(in_RDI + 8) + 0x380),(char *)0x1,
                    "   Large so set max_abs_cost = sqrt(sqrt(max_abs_cost)) = %g\n");
      }
    }
    local_58 = (HighsLogOptions *)0x0;
    local_5c = *(int *)(in_RDI + 0x2198) + *(int *)(in_RDI + 0x219c);
    for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25d8),
                          (long)local_60);
      local_58 = (HighsLogOptions *)
                 ((double)(*pvVar5 <= 1e+30 && *pvVar5 != 1e+30) + (double)local_58);
    }
    local_58 = (HighsLogOptions *)((double)local_58 / (double)local_5c);
    if ((double)local_58 < 0.01) {
      local_68 = 1.0;
      pdVar6 = std::min<double>((double *)&local_28,&local_68);
      local_28 = (HighsLogOptions *)*pdVar6;
      if ((local_12 & 1) != 0) {
        highsLogDev(local_58,(HighsLogType)local_28,(char *)(*(long *)(in_RDI + 8) + 0x380),1,
                    "   Small boxedRate (%g) so set max_abs_cost = min(max_abs_cost, 1.0) = %g\n");
      }
    }
    *(HighsLogOptions **)(in_RDI + 0x36f0) = local_28;
    *(double *)(in_RDI + 0x36e8) = *(double *)(in_RDI + 0x2818) * 5e-07 * (double)local_28;
    if ((local_12 & 1) != 0) {
      highsLogDev(*(HighsLogOptions **)(in_RDI + 0x36e8),
                  (HighsLogType)(*(long *)(in_RDI + 8) + 0x380),(char *)0x1,
                  "   Perturbation column base = %g\n");
    }
    for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x2198); local_6c = local_6c + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21b8),
                          (long)local_6c);
      dVar7 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21d0),
                          (long)local_6c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2680),
                          (long)local_6c);
      dVar2 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                          (long)local_6c);
      local_d0 = (dVar2 + 1.0) * (ABS(*pvVar5) + 1.0) * *(double *)(in_RDI + 0x36e8);
      if ((-INFINITY < dVar7) || (dVar1 < INFINITY)) {
        if (dVar1 < INFINITY) {
          if (-INFINITY < dVar7) {
            if ((dVar7 != dVar1) || (NAN(dVar7) || NAN(dVar1))) {
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                                  (long)local_6c);
              if (*pvVar5 < 0.0) {
                local_d0 = -local_d0;
              }
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                                  (long)local_6c);
              *pvVar5 = local_d0 + *pvVar5;
            }
          }
          else {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                                (long)local_6c);
            *pvVar5 = -local_d0 + *pvVar5;
          }
        }
        else {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                              (long)local_6c);
          *pvVar5 = local_d0 + *pvVar5;
        }
      }
    }
    log_options_ = (HighsLogOptions *)(*(double *)(in_RDI + 0x2818) * 1e-12);
    if ((local_12 & 1) != 0) {
      highsLogDev(log_options_,(HighsLogType)(*(long *)(in_RDI + 8) + 0x380),(char *)0x1,
                  "   Perturbation row    base = %g\n");
    }
    for (local_94 = *(int *)(in_RDI + 0x2198); local_94 < local_5c; local_94 = local_94 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2680),
                          (long)local_94);
      dVar7 = (0.5 - *pvVar5) * (double)log_options_;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                          (long)local_94);
      *pvVar5 = dVar7 + *pvVar5;
    }
    *(undefined1 *)(in_RDI + 0x28d5) = 1;
  }
  return;
}

Assistant:

void HEkk::initialiseCost(const SimplexAlgorithm algorithm,
                          const HighsInt solve_phase, const bool perturb) {
  // Copy the cost
  initialiseLpColCost();
  initialiseLpRowCost();
  info_.costs_shifted = false;
  info_.costs_perturbed = false;
  analysis_.net_num_single_cost_shift = 0;
  // Primal simplex costs are either from the LP or set specially in phase 1
  if (algorithm == SimplexAlgorithm::kPrimal) return;
  // Dual simplex costs are either from the LP or perturbed
  if (!perturb || info_.dual_simplex_cost_perturbation_multiplier == 0) return;
  // Perturb the original costs, scale down if is too big
  const bool report_cost_perturbation =
      options_->output_flag;  // && analysis_.analyse_simplex_runtime_data;
  HighsInt num_original_nonzero_cost = 0;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "Cost perturbation for %s\n", lp_.model_name_.c_str());
  double min_abs_cost = kHighsInf;
  double max_abs_cost = 0;
  double sum_abs_cost = 0;
  for (HighsInt i = 0; i < lp_.num_col_; i++) {
    const double abs_cost = fabs(info_.workCost_[i]);
    if (report_cost_perturbation) {
      if (abs_cost) {
        num_original_nonzero_cost++;
        min_abs_cost = min(min_abs_cost, abs_cost);
      }
      sum_abs_cost += abs_cost;
    }
    max_abs_cost = max(max_abs_cost, abs_cost);
  }
  const HighsInt pct0 = (100 * num_original_nonzero_cost) / lp_.num_col_;
  double average_abs_cost = 0;
  if (report_cost_perturbation) {
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Initially have %" HIGHSINT_FORMAT
                " nonzero costs (%3" HIGHSINT_FORMAT "%%)",
                num_original_nonzero_cost, pct0);
    if (num_original_nonzero_cost) {
      average_abs_cost = sum_abs_cost / num_original_nonzero_cost;
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  " with min / average / max = %g / %g / %g\n", min_abs_cost,
                  average_abs_cost, max_abs_cost);
    } else {
      min_abs_cost = 1.0;
      max_abs_cost = 1.0;
      average_abs_cost = 1.0;
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  " but perturb as if max cost was 1\n");
    }
  }
  if (max_abs_cost > 100) {
    max_abs_cost = sqrt(sqrt(max_abs_cost));
    if (report_cost_perturbation)
      highsLogDev(
          options_->log_options, HighsLogType::kInfo,
          "   Large so set max_abs_cost = sqrt(sqrt(max_abs_cost)) = %g\n",
          max_abs_cost);
  }

  // If there are few boxed variables, we will just use simple perturbation
  double boxedRate = 0;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt i = 0; i < num_tot; i++)
    boxedRate += (info_.workRange_[i] < 1e30);
  boxedRate /= num_tot;
  if (boxedRate < 0.01) {
    max_abs_cost = min(max_abs_cost, 1.0);
    if (report_cost_perturbation)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "   Small boxedRate (%g) so set max_abs_cost = "
                  "min(max_abs_cost, 1.0) = "
                  "%g\n",
                  boxedRate, max_abs_cost);
  }
  // Determine the perturbation base
  cost_perturbation_max_abs_cost_ = max_abs_cost;
  cost_perturbation_base_ =
      info_.dual_simplex_cost_perturbation_multiplier * 5e-7 * max_abs_cost;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Perturbation column base = %g\n", cost_perturbation_base_);

  // Now do the perturbation
  for (HighsInt i = 0; i < lp_.num_col_; i++) {
    double lower = lp_.col_lower_[i];
    double upper = lp_.col_upper_[i];
    double xpert = (1 + info_.numTotRandomValue_[i]) *
                   (fabs(info_.workCost_[i]) + 1) * cost_perturbation_base_;
    // const double previous_cost = info_.workCost_[i];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free - no perturb
    } else if (upper >= kHighsInf) {  // Lower
      info_.workCost_[i] += xpert;
    } else if (lower <= -kHighsInf) {  // Upper
      info_.workCost_[i] += -xpert;
    } else if (lower != upper) {  // Boxed
      info_.workCost_[i] += (info_.workCost_[i] >= 0) ? xpert : -xpert;
    } else {
      // Fixed - no perturb
    }
    //    if (report_cost_perturbation) {
    //      const double perturbation1 = fabs(info_.workCost_[i] -
    //      previous_cost); if (perturbation1)
    //        updateValueDistribution(perturbation1,
    //                                analysis_.cost_perturbation1_distribution);
    //    }
  }
  const double row_cost_perturbation_base_ =
      info_.dual_simplex_cost_perturbation_multiplier * 1e-12;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Perturbation row    base = %g\n",
                row_cost_perturbation_base_);
  for (HighsInt i = lp_.num_col_; i < num_tot; i++) {
    double perturbation2 =
        (0.5 - info_.numTotRandomValue_[i]) * row_cost_perturbation_base_;
    info_.workCost_[i] += perturbation2;
    //    if (report_cost_perturbation) {
    //      perturbation2 = fabs(perturbation2);
    //      updateValueDistribution(perturbation2,
    //                              analysis_.cost_perturbation2_distribution);
    //    }
  }
  info_.costs_perturbed = true;
}